

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O3

void __thiscall
Diligent::HashMapStringKey::HashMapStringKey(HashMapStringKey *this,Char *_Str,bool bMakeCopy)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  Char *__dest;
  ulong uVar5;
  string msg;
  string local_50;
  
  this->Str = _Str;
  this->Ownership_Hash = 0;
  if (_Str == (Char *)0x0) {
    FormatString<char[32]>(&local_50,(char (*) [32])"String pointer must not be null");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"HashMapStringKey",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0xec);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    _Str = this->Str;
    if (_Str == (char *)0x0) {
      _Str = (char *)0x0;
      uVar5 = 0;
      goto LAB_001b8174;
    }
  }
  pcVar3 = _Str;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
    uVar2 = uVar5 * 0x1003f + (long)cVar1;
  } while ((long)cVar1 != 0);
LAB_001b8174:
  this->Ownership_Hash = uVar5 & 0x7fffffffffffffff;
  if (bMakeCopy) {
    sVar4 = strlen(_Str);
    __dest = (Char *)operator_new__(sVar4 + 1);
    memcpy(__dest,_Str,sVar4 + 1);
    this->Str = __dest;
    this->Ownership_Hash = uVar5 | 0x8000000000000000;
  }
  return;
}

Assistant:

HashMapStringKey(const Char* _Str, bool bMakeCopy = false) :
        Str{_Str}
    {
        VERIFY(Str, "String pointer must not be null");

        Ownership_Hash = CStringHash<Char>{}.operator()(Str) & HashMask;
        if (bMakeCopy)
        {
            auto  LenWithZeroTerm = strlen(Str) + 1;
            auto* StrCopy         = new char[LenWithZeroTerm];
            std::memcpy(StrCopy, Str, LenWithZeroTerm);
            Str = StrCopy;
            Ownership_Hash |= StrOwnershipMask;
        }
    }